

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatTimeInMillisAsDuration_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  ostream *poVar1;
  string *psVar2;
  stringstream local_1a0 [8];
  stringstream ss;
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<double>((double)(long)this * 0.001);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"s",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  psVar2 = (string *)std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

static std::string FormatTimeInMillisAsDuration(TimeInMillis ms) {
  ::std::stringstream ss;
  ss << (static_cast<double>(ms) * 1e-3) << "s";
  return ss.str();
}